

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                 e)

{
  Precedence PVar1;
  undefined8 *puVar2;
  char *__s;
  size_t __n;
  Precedence precedence;
  ptrdiff_t _Num;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *str;
  
  PVar1 = mp::expr::PrecInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_];
  precedence = UNARY;
  if (PVar1 != EXPONENTIATION) {
    precedence = PVar1;
  }
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(NumericExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                       impl_ + 8))->impl_,precedence);
  lVar4 = *(long *)(this + 8);
  puVar2 = *(undefined8 **)(lVar4 + 8);
  lVar3 = puVar2[2];
  if (lVar3 == puVar2[3]) {
    (**(code **)*puVar2)(puVar2,lVar3 + 1);
    lVar3 = puVar2[2];
  }
  puVar2[2] = lVar3 + 1;
  *(undefined1 *)(puVar2[1] + lVar3) = 0x20;
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_].
        str;
  __n = strlen(__s);
  puVar2 = *(undefined8 **)(lVar4 + 8);
  uVar5 = puVar2[2] + __n;
  if ((ulong)puVar2[3] < uVar5) {
    (**(code **)*puVar2)(puVar2,uVar5);
  }
  if (__n != 0) {
    memmove((void *)(puVar2[1] + puVar2[2]),__s,__n);
  }
  puVar2[2] = uVar5;
  puVar2 = *(undefined8 **)(lVar4 + 8);
  lVar4 = puVar2[2];
  if (lVar4 == puVar2[3]) {
    (**(code **)*puVar2)(puVar2,lVar4 + 1);
    lVar4 = puVar2[2];
  }
  puVar2[2] = lVar4 + 1;
  *(undefined1 *)(puVar2[1] + lVar4) = 0x20;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(NumericExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                       impl_ + 0x10))->impl_,(PVar1 != EXPONENTIATION) + PVar1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}